

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset_props.cpp
# Opt level: O1

int32_t uset_applyPattern_63
                  (USet *set,UChar *pattern,int32_t patternLength,uint32_t options,
                  UErrorCode *status)

{
  int32_t iVar1;
  ParsePosition pos;
  UnicodeString pat;
  ParsePosition local_70;
  UnicodeString local_60;
  
  iVar1 = 0;
  if ((status != (UErrorCode *)0x0) && (iVar1 = 0, *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (set == (USet *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      icu_63::UnicodeString::UnicodeString(&local_60,pattern,patternLength);
      local_70.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003dc090;
      local_70.index = 0;
      local_70.errorIndex = -1;
      icu_63::UnicodeSet::applyPattern
                ((UnicodeSet *)set,&local_60,&local_70,options,(SymbolTable *)0x0,status);
      iVar1 = local_70.index;
      icu_63::ParsePosition::~ParsePosition(&local_70);
      icu_63::UnicodeString::~UnicodeString(&local_60);
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2 
uset_applyPattern(USet *set,
                  const UChar *pattern, int32_t patternLength,
                  uint32_t options,
                  UErrorCode *status){

    // status code needs to be checked since we 
    // dereference it
    if(status == NULL || U_FAILURE(*status)){
        return 0;
    }

    // check only the set paramenter
    // if pattern is NULL or null terminate
    // UnicodeString constructor takes care of it
    if(set == NULL){
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    UnicodeString pat(pattern, patternLength);

    ParsePosition pos;
   
    ((UnicodeSet*) set)->applyPattern(pat, pos, options, NULL, *status);
    
    return pos.getIndex();
}